

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O3

int __thiscall bwtil::cw_bwt::init(cw_bwt *this,EVP_PKEY_CTX *ctx)

{
  pointer pDVar1;
  ulint uVar2;
  pointer pDVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  long lVar13;
  ulint uVar14;
  ulint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  double dVar28;
  undefined1 in_ZMM1 [64];
  undefined1 auVar29 [64];
  undefined1 in_XMM8 [16];
  
  this->number_of_contexts = (this->ca).number_of_k_mers;
  this->sigma = (this->ca).sigma;
  this->TERMINATOR = '\0';
  initStructures(this);
  build(this);
  uVar2 = this->number_of_contexts;
  if (uVar2 == 0) {
    dVar27 = 0.0;
    dVar28 = 0.0;
  }
  else {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pDVar3 = (this->dynStrings).
             super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar20 = vpternlogd_avx512f(in_ZMM1,in_ZMM1,in_ZMM1,0xff);
    lVar12 = 0;
    uVar14 = 0;
    lVar13 = 0;
    do {
      pDVar1 = pDVar3 + uVar14;
      if (pDVar3[uVar14].unary_string == false) {
        if (pDVar1->number_of_internal_nodes == 0) {
          uVar15 = 0;
        }
        else {
          lVar4 = *(long *)&(pDVar1->wavelet_tree).
                            super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                            ._M_impl.super__Vector_impl_data;
          auVar29 = ZEXT1664((undefined1  [16])0x0);
          auVar21 = vpbroadcastq_avx512f();
          uVar16 = (ulong)(pDVar1->number_of_internal_nodes + 7 & 0xfffffff8);
          uVar17 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar23 = vmovdqa64_avx512f(auVar29);
            auVar29 = vporq_avx512f(auVar22,auVar19);
            uVar9 = vpcmpuq_avx512f(auVar29,auVar21,2);
            vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar4 + uVar17 * 8));
            uVar17 = uVar17 + 8;
            auVar29 = vpgatherqq_avx512f(_DAT_00000000);
            auVar22._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar29._8_8_;
            auVar22._0_8_ = (ulong)((byte)uVar9 & 1) * auVar29._0_8_;
            auVar22._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar29._16_8_;
            auVar22._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar29._24_8_;
            auVar22._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * auVar29._32_8_;
            auVar22._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * auVar29._40_8_;
            auVar22._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * auVar29._48_8_;
            auVar22._56_8_ = (uVar9 >> 7) * auVar29._56_8_;
            auVar29 = vpaddq_avx512f(auVar22,auVar23);
          } while (uVar16 != uVar17);
          auVar22 = vmovdqa64_avx512f(auVar29);
          bVar6 = (bool)((byte)uVar9 & 1);
          auVar29._0_8_ = (ulong)bVar6 * auVar22._0_8_ | (ulong)!bVar6 * auVar23._0_8_;
          bVar6 = (bool)((byte)(uVar9 >> 1) & 1);
          auVar29._8_8_ = (ulong)bVar6 * auVar22._8_8_ | (ulong)!bVar6 * auVar23._8_8_;
          bVar6 = (bool)((byte)(uVar9 >> 2) & 1);
          auVar29._16_8_ = (ulong)bVar6 * auVar22._16_8_ | (ulong)!bVar6 * auVar23._16_8_;
          bVar6 = (bool)((byte)(uVar9 >> 3) & 1);
          auVar29._24_8_ = (ulong)bVar6 * auVar22._24_8_ | (ulong)!bVar6 * auVar23._24_8_;
          bVar6 = (bool)((byte)(uVar9 >> 4) & 1);
          auVar29._32_8_ = (ulong)bVar6 * auVar22._32_8_ | (ulong)!bVar6 * auVar23._32_8_;
          bVar6 = (bool)((byte)(uVar9 >> 5) & 1);
          auVar29._40_8_ = (ulong)bVar6 * auVar22._40_8_ | (ulong)!bVar6 * auVar23._40_8_;
          bVar6 = (bool)((byte)(uVar9 >> 6) & 1);
          auVar29._48_8_ = (ulong)bVar6 * auVar22._48_8_ | (ulong)!bVar6 * auVar23._48_8_;
          auVar29._56_8_ =
               (uVar9 >> 7) * auVar22._56_8_ | (ulong)!SUB81(uVar9 >> 7,0) * auVar23._56_8_;
          auVar18 = vextracti64x4_avx512f(auVar29,1);
          auVar29 = vpaddq_avx512f(auVar29,ZEXT3264(auVar18));
          auVar8 = vpaddq_avx(auVar29._0_16_,auVar29._16_16_);
          auVar7 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpaddq_avx(auVar8,auVar7);
          auVar29 = ZEXT1664((undefined1  [16])0x0);
          lVar13 = lVar13 + auVar8._0_8_;
          uVar17 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar23 = vmovdqa64_avx512f(auVar29);
            auVar29 = vporq_avx512f(auVar22,auVar19);
            uVar9 = vpcmpuq_avx512f(auVar29,auVar21,2);
            vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar4 + uVar17 * 8));
            uVar17 = uVar17 + 8;
            auVar29 = vpgatherqq_avx512f(_DAT_00000000);
            bVar5 = (byte)uVar9;
            auVar24._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar29._8_8_;
            auVar24._0_8_ = (ulong)(bVar5 & 1) * auVar29._0_8_;
            auVar24._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar29._16_8_;
            auVar24._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar29._24_8_;
            auVar24._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * auVar29._32_8_;
            auVar24._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * auVar29._40_8_;
            auVar24._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * auVar29._48_8_;
            auVar24._56_8_ = (uVar9 >> 7) * auVar29._56_8_;
            auVar29 = vpgatherqq_avx512f(_DAT_00000050);
            auVar25._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar29._8_8_;
            auVar25._0_8_ = (ulong)(bVar5 & 1) * auVar29._0_8_;
            auVar25._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar29._16_8_;
            auVar25._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar29._24_8_;
            auVar25._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * auVar29._32_8_;
            auVar25._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * auVar29._40_8_;
            auVar25._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * auVar29._48_8_;
            auVar25._56_8_ = (uVar9 >> 7) * auVar29._56_8_;
            auVar29 = vpsubq_avx512f(auVar25,auVar20);
            auVar29 = vpmullq_avx512dq(auVar29,auVar24);
            auVar29 = vpaddq_avx512f(auVar29,auVar23);
          } while (uVar16 != uVar17);
          auVar21 = vmovdqa64_avx512f(auVar29);
          auVar26._0_8_ =
               (ulong)(bVar5 & 1) * auVar21._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar23._0_8_;
          bVar6 = (bool)((byte)(uVar9 >> 1) & 1);
          auVar26._8_8_ = (ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * auVar23._8_8_;
          bVar6 = (bool)((byte)(uVar9 >> 2) & 1);
          auVar26._16_8_ = (ulong)bVar6 * auVar21._16_8_ | (ulong)!bVar6 * auVar23._16_8_;
          bVar6 = (bool)((byte)(uVar9 >> 3) & 1);
          auVar26._24_8_ = (ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * auVar23._24_8_;
          bVar6 = (bool)((byte)(uVar9 >> 4) & 1);
          auVar26._32_8_ = (ulong)bVar6 * auVar21._32_8_ | (ulong)!bVar6 * auVar23._32_8_;
          bVar6 = (bool)((byte)(uVar9 >> 5) & 1);
          auVar26._40_8_ = (ulong)bVar6 * auVar21._40_8_ | (ulong)!bVar6 * auVar23._40_8_;
          bVar6 = (bool)((byte)(uVar9 >> 6) & 1);
          auVar26._48_8_ = (ulong)bVar6 * auVar21._48_8_ | (ulong)!bVar6 * auVar23._48_8_;
          auVar26._56_8_ =
               (uVar9 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar9 >> 7,0) * auVar23._56_8_;
          auVar18 = vextracti64x4_avx512f(auVar26,1);
          auVar21 = vpaddq_avx512f(auVar26,ZEXT3264(auVar18));
          auVar8 = vpaddq_avx(auVar21._0_16_,auVar21._16_16_);
          auVar7 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpaddq_avx(auVar8,auVar7);
          uVar15 = auVar8._0_8_;
        }
      }
      else {
        uVar15 = pDVar1->n;
        lVar13 = lVar13 + uVar15;
      }
      lVar12 = lVar12 + uVar15;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar2);
    auVar8 = vcvtusi2sd_avx512f(in_XMM8,lVar12);
    dVar28 = auVar8._0_8_;
    auVar8 = vcvtusi2sd_avx512f(in_XMM8,lVar13);
    dVar27 = auVar8._0_8_;
  }
  if (this->verbose == false) {
    return (int)uVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nAverage packed B-tree height is: ",0x22);
  poVar11 = std::ostream::_M_insert<double>(dVar28 / dVar27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  iVar10 = std::ostream::flush();
  return iVar10;
}

Assistant:

void init(){

		number_of_contexts = ca.numberOfStates();

		sigma = ca.alphabetSize();//this takes into account also the terminator character
		TERMINATOR = 0;

		initStructures();

		build();

		ulint sum_of_heights=0;
		ulint sum_of_lenghts=0;

		for(ulint i=0;i<number_of_contexts;i++){

			sum_of_lenghts += dynStrings[i].numberOfBits();
			sum_of_heights += dynStrings[i].sumOfHeights();

		}

		double avg_height = (double)sum_of_heights/(double)sum_of_lenghts;

		if(verbose) cout << "\nAverage packed B-tree height is: " << avg_height << endl;

	}